

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# consolelog.hpp
# Opt level: O0

void __thiscall
github111116::ConsoleLogger::log<char[14],char_const*>
          (ConsoleLogger *this,char (*args) [14],char **args_1)

{
  char (*in_RDX) [14];
  ConsoleLogger *in_RSI;
  mutex *in_RDI;
  
  if (*(int *)((long)&in_RDI[2].super___mutex_base._M_mutex + 0x1c) < 1) {
    std::mutex::lock(in_RDI);
    std::operator<<((ostream *)(in_RDI->super___mutex_base)._M_mutex.__align,"    ");
    print<char[14],char_const*>(in_RSI,in_RDX,(char **)in_RDI);
    std::mutex::unlock((mutex *)0x1889ff);
  }
  return;
}

Assistant:

void ConsoleLogger::log(const Args&... args)
{
	if (loglevel > 0) return;
	mtx.lock();
	out << "    ";
	print(args...);
	mtx.unlock();
}